

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosinski-decompress.c
# Opt level: O0

void KosinskiDecompress(KosinskiDecompressCallbacks *callbacks,cc_bool print_debug_information)

{
  size_t sVar1;
  cc_bool cVar2;
  uint uVar3;
  uint uVar4;
  uchar high_byte;
  uchar low_byte;
  size_t position_1;
  size_t count;
  uint distance;
  uchar byte;
  size_t position;
  cc_bool print_debug_information_local;
  KosinskiDecompressCallbacks *callbacks_local;
  
  read_position = 0;
  write_position = 0;
  GetDescriptor(callbacks);
LAB_001023e1:
  do {
    while (cVar2 = PopDescriptor(callbacks), sVar1 = read_position, cVar2 != '\0') {
      uVar3 = ReadByte(callbacks);
      if (print_debug_information != '\0') {
        fprintf(_stderr,"%lX - Literal match: At %lX, value %X\n",sVar1,write_position,
                (ulong)(byte)uVar3);
      }
      WriteByte(uVar3 & 0xff,callbacks);
    }
    cVar2 = PopDescriptor(callbacks);
    sVar1 = read_position;
    if (cVar2 == '\0') {
      position_1 = 2;
      cVar2 = PopDescriptor(callbacks);
      if (cVar2 != '\0') {
        position_1 = 4;
      }
      cVar2 = PopDescriptor(callbacks);
      if (cVar2 != '\0') {
        position_1 = position_1 + 1;
      }
      uVar3 = ReadByte(callbacks);
      count._0_4_ = (uVar3 ^ 0xff) + 1;
      if (print_debug_information != '\0') {
        fprintf(_stderr,"%lX - Inline match: At %lX, src %lX, len %lX\n",read_position - 1,
                write_position,write_position - (uint)count,position_1);
      }
    }
    else {
      uVar3 = ReadByte(callbacks);
      uVar4 = ReadByte(callbacks);
      count._0_4_ = (((uVar4 & 0xf8) << 5 | uVar3 & 0xff) ^ 0x1fff) + 1;
      if ((long)(int)(uVar4 & 7) == 0) {
        uVar3 = ReadByte(callbacks);
        position_1 = (size_t)(uVar3 + 1);
        if (position_1 == 1) {
          if (print_debug_information != '\0') {
            fprintf(_stderr,"%lX - Terminator: At %lX, src %lX\n",sVar1,write_position,
                    write_position - (uint)count);
          }
          return;
        }
        if (position_1 == 2) {
          if (print_debug_information != '\0') {
            fprintf(_stderr,"%lX - 0xA000 boundary flag: At %lX, src %lX\n",sVar1,write_position,
                    write_position - (uint)count);
          }
          goto LAB_001023e1;
        }
        if (print_debug_information != '\0') {
          fprintf(_stderr,"%lX - Extended full match: At %lX, src %lX, len %lX\n",sVar1,
                  write_position,write_position - (uint)count,position_1);
        }
      }
      else {
        position_1 = (long)(int)(uVar4 & 7) + 2;
        if (print_debug_information != '\0') {
          fprintf(_stderr,"%lX - Full match: At %lX, src %lX, len %lX\n",sVar1,write_position,
                  write_position - (uint)count,position_1);
        }
      }
    }
    while (position_1 != 0) {
      WriteByte((uint)backsearch_buffer[write_position - (uint)count & 0x1fff],callbacks);
      position_1 = position_1 - 1;
    }
  } while( true );
}

Assistant:

void KosinskiDecompress(const KosinskiDecompressCallbacks* const callbacks, const cc_bool print_debug_information)
{
	read_position = 0;
	write_position = 0;

	GetDescriptor(callbacks);

	for (;;)
	{
		if (PopDescriptor(callbacks))
		{
			const size_t position = read_position;

			const unsigned char byte = ReadByte(callbacks);

			if (print_debug_information)
				fprintf(stderr, "%lX - Literal match: At %lX, value %X\n", (unsigned long)position, (unsigned long)write_position, byte);

			WriteByte(byte, callbacks);
		}
		else
		{
			unsigned int distance;
			size_t count;

			if (PopDescriptor(callbacks))
			{
				const size_t position = read_position;

				const unsigned char low_byte = ReadByte(callbacks);
				const unsigned char high_byte = ReadByte(callbacks);

				distance = ((high_byte & 0xF8) << 5) | low_byte;
				distance = (distance ^ 0x1FFF) + 1; /* Convert from negative two's-complement to positive */
				count = high_byte & 7;

				if (count != 0)
				{
					count += 2;

					if (print_debug_information)
						fprintf(stderr, "%lX - Full match: At %lX, src %lX, len %lX\n", (unsigned long)position, (unsigned long)write_position, (unsigned long)(write_position - distance), (unsigned long)count);
				}
				else
				{
					count = ReadByte(callbacks) + 1;

					if (count == 1)
					{
						if (print_debug_information)
							fprintf(stderr, "%lX - Terminator: At %lX, src %lX\n", (unsigned long)position, (unsigned long)write_position, (unsigned long)(write_position - distance));

						break;
					}
					else if (count == 2)
					{
						if (print_debug_information)
							fprintf(stderr, "%lX - 0xA000 boundary flag: At %lX, src %lX\n", (unsigned long)position, (unsigned long)write_position, (unsigned long)(write_position - distance));

						continue;
					}
					else
					{
						if (print_debug_information)
							fprintf(stderr, "%lX - Extended full match: At %lX, src %lX, len %lX\n", (unsigned long)position, (unsigned long)write_position, (unsigned long)(write_position - distance), (unsigned long)count);
					}
				}
			}
			else
			{
				count = 2;

				if (PopDescriptor(callbacks))
					count += 2;
				if (PopDescriptor(callbacks))
					count += 1;

				distance = (ReadByte(callbacks) ^ 0xFF) + 1; /* Convert from negative two's-complement to positive */

				if (print_debug_information)
					fprintf(stderr, "%lX - Inline match: At %lX, src %lX, len %lX\n", (unsigned long)(read_position - 1), (unsigned long)write_position, (unsigned long)(write_position - distance), (unsigned long)count);
			}

			while (count-- != 0)
				WriteByte(backsearch_buffer[(write_position - distance) % SLIDING_WINDOW_SIZE], callbacks);
		}
	}
}